

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O1

Def * Shell::FunctionDefinition::isFunctionDefinition(FormulaUnit *unit,bool inHigherOrder)

{
  Connective CVar1;
  Def *pDVar2;
  
  do {
    unit = (FormulaUnit *)unit->_formula;
    CVar1 = (unit->super_Unit)._number;
  } while (CVar1 == FORALL);
  if (CVar1 == LITERAL) {
    pDVar2 = isFunctionDefinition((Literal *)(unit->super_Unit)._inference._ptr2,inHigherOrder);
    return pDVar2;
  }
  return (Def *)0x0;
}

Assistant:

FunctionDefinition::Def*
FunctionDefinition::isFunctionDefinition (FormulaUnit& unit, bool inHigherOrder)
{
  Formula* f = unit.formula();
  // skip all universal quantifiers in front of the formula
  while (f->connective() == FORALL) {
    f = f->qarg();
  }

  if (f->connective() != LITERAL) {
    return 0;
  }
  return isFunctionDefinition(f->literal(), inHigherOrder);
}